

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  DefaultPropertyCaseItemSyntax *pDVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultPropertyCaseItemSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,
                      (PropertyExprSyntax *)args_2,&local_60);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultPropertyCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultPropertyCaseItemSyntax>(
        node.defaultKeyword.deepClone(alloc),
        node.colon.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}